

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZOneShapeRestraint.h
# Opt level: O1

void __thiscall TPZOneShapeRestraint::Print(TPZOneShapeRestraint *this,ostream *out)

{
  char cVar1;
  ostream *poVar2;
  long lVar3;
  int i;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"TPZOneShapeRestraint ConnectIndex/Degree of freedom : ",0x36);
  lVar3 = 0;
  do {
    poVar2 = std::ostream::_M_insert<long>((long)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"/",1);
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,*(int *)((long)&((this->fFaces).super_TPZVec<std::pair<long,_int>_>.
                                               fStore)->second + lVar3));
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x40);
  cVar1 = (char)out;
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Orientation of each face ",0x19);
  lVar3 = 0;
  do {
    poVar2 = (ostream *)
             std::ostream::operator<<(out,(this->fOrient).super_TPZVec<int>.fStore[lVar3]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  return;
}

Assistant:

void Print(std::ostream &out) const
    {
        out << "TPZOneShapeRestraint ConnectIndex/Degree of freedom : ";
        for(int i=0; i<4; i++) out << fFaces[i].first << "/" << fFaces[i].second << " ";
        out << std::endl;
        out << "Orientation of each face ";
        for(int i=0; i<4; i++) out << fOrient[i] << " ";
        out << std::endl;
    }